

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O2

void __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_false>::setCache
          (CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_false> *this,randomx_cache *cache)

{
  *(randomx_cache **)
   &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>).field_0x9f8 = cache;
  *(uint8_t **)&(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>).field_0x9e8 =
       cache->memory;
  JitCompilerX86::generateSuperscalarHash<8ul>
            (&(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>).compiler,
             &cache->programs,&cache->reciprocalCache);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::setCache(randomx_cache* cache) {
		cachePtr = cache;
		mem.memory = cache->memory;
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateSuperscalarHash(cache->programs, cache->reciprocalCache);
		if (secureJit) {
			compiler.enableExecution();
		}
	}